

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_coin.cpp
# Opt level: O3

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::api::CoinApi::ConvertToUtxo
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinApi *this,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  pointer pUVar1;
  CoinApi *this_00;
  UtxoData *utxo_data;
  pointer utxo_data_00;
  pointer utxo;
  
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (CoinApi *)__return_storage_ptr__;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (__return_storage_ptr__,
             ((long)(utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 4) * -0x6474a8819ec8e951);
  utxo_data_00 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  pUVar1 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (utxo_data_00 != pUVar1) {
    utxo = (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
           _M_impl.super__Vector_impl_data._M_start;
    do {
      ConvertToUtxo(this_00,utxo_data_00,utxo);
      utxo = utxo + 1;
      utxo_data_00 = utxo_data_00 + 1;
    } while (utxo_data_00 != pUVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Utxo> CoinApi::ConvertToUtxo(
    const std::vector<UtxoData>& utxos) const {
  std::vector<Utxo> result;
  result.resize(utxos.size());
  std::vector<Utxo>::iterator ite = result.begin();
  for (const auto& utxo_data : utxos) {
    ConvertToUtxo(utxo_data, &(*ite));
    ++ite;
  }
  return result;
}